

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindGenericRoundFunctionDecimal<duckdb::TruncDecimalOperator>
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  uint8_t uVar1;
  pointer pEVar2;
  undefined8 in_RDX;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  uint8_t width;
  uint8_t scale;
  LogicalType *decimal_type;
  size_type in_stack_ffffffffffffff98;
  LogicalType *this;
  undefined7 in_stack_ffffffffffffffa0;
  PhysicalType in_stack_ffffffffffffffa7;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this_00;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_ffffffffffffffb8;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffffc0;
  undefined2 uVar3;
  
  uVar3 = (undefined2)((ulong)in_RDX >> 0x30);
  this_00._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  this = &pEVar2->return_type;
  uVar1 = DecimalType::GetScale
                    ((LogicalType *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  DecimalType::GetWidth
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  if (uVar1 == '\0') {
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    in_stack_ffffffffffffffa7 = LogicalType::InternalType(this);
    if (in_stack_ffffffffffffffa7 == INT16) {
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else if (in_stack_ffffffffffffffa7 == INT32) {
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else if (in_stack_ffffffffffffffa7 == INT64) {
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  vector<duckdb::LogicalType,_true>::operator[]
            ((vector<duckdb::LogicalType,_true> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),(size_type)this);
  LogicalType::operator=
            ((LogicalType *)this_00._M_head_impl,
             (LogicalType *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  LogicalType::DECIMAL((uint8_t)((ushort)uVar3 >> 8),(uint8_t)uVar3);
  LogicalType::operator=
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),this);
  LogicalType::~LogicalType((LogicalType *)0x2085571);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<std::default_delete<duckdb::FunctionData>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),this);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> BindGenericRoundFunctionDecimal(ClientContext &context, ScalarFunction &bound_function,
                                                         vector<unique_ptr<Expression>> &arguments) {
	// ceil essentially removes the scale
	auto &decimal_type = arguments[0]->return_type;
	auto scale = DecimalType::GetScale(decimal_type);
	auto width = DecimalType::GetWidth(decimal_type);
	if (scale == 0) {
		bound_function.function = ScalarFunction::NopFunction;
	} else {
		switch (decimal_type.InternalType()) {
		case PhysicalType::INT16:
			bound_function.function = GenericRoundFunctionDecimal<int16_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT32:
			bound_function.function = GenericRoundFunctionDecimal<int32_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT64:
			bound_function.function = GenericRoundFunctionDecimal<int64_t, NumericHelper, OP>;
			break;
		default:
			bound_function.function = GenericRoundFunctionDecimal<hugeint_t, Hugeint, OP>;
			break;
		}
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = LogicalType::DECIMAL(width, 0);
	return nullptr;
}